

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isCubeMipmapLinearSampleResultValid
               (ConstPixelBufferAccess (*faces0) [6],ConstPixelBufferAccess (*faces1) [6],
               Sampler *sampler,FilterMode levelFilter,LookupPrecision *prec,
               CubeFaceFloatCoords *coords,Vec2 *fBounds,Vec4 *result)

{
  TextureFormat *pTVar1;
  CubeFace CVar2;
  int dim;
  int dim_00;
  float fVar3;
  float fVar4;
  void *pvVar5;
  bool bVar6;
  TextureChannelClass TVar7;
  float fVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  ulong uVar18;
  CubeFaceFloatCoords *pCVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  Sampler *sampler_00;
  float fVar24;
  ChannelType CVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  CubeFaceIntCoords CVar33;
  CubeFaceIntCoords CVar34;
  ConstPixelBufferAccess local_248;
  TextureChannelClass local_220;
  float local_21c;
  TextureFormat local_218;
  int aiStack_210 [2];
  Sampler *local_208;
  CubeFaceFloatCoords *local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  uint local_1b8;
  int local_1b4;
  float local_1b0;
  float local_1ac;
  int local_1a8;
  int local_1a4;
  ConstPixelBufferAccess (*local_1a0) [6];
  undefined1 local_198 [16];
  ColorQuad quad1;
  Vec2 vBounds0;
  Vec2 local_100;
  Vec2 local_f8;
  Vec2 vBounds1;
  Vec2 uBounds1;
  Vec2 uBounds0;
  float local_c8;
  ColorQuad quad0;
  
  if (levelFilter == LINEAR) {
    CVar2 = coords->face;
    local_248.m_data = faces0;
    if (sampler->seamlessCubeMap == true) {
      dim = (*faces0)[CVar2].m_size.m_data[0];
      dim_00 = (*faces1)[CVar2].m_size.m_data[0];
      local_200 = coords;
      local_1a0 = faces1;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_00,local_200->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim,local_200->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      local_208 = sampler;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_00,local_200->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar26 = floorf(uBounds0.m_data[0] + -0.5);
      local_1c0 = CONCAT44(local_1c0._4_4_,fVar26);
      fVar26 = floorf(uBounds0.m_data[1] + -0.5);
      local_1c8 = CONCAT44(local_1c8._4_4_,fVar26);
      fVar26 = floorf(uBounds1.m_data[0] + -0.5);
      local_1f8 = CONCAT44(local_1f8._4_4_,fVar26);
      fVar26 = floorf(uBounds1.m_data[1] + -0.5);
      local_1f0 = CONCAT44(local_1f0._4_4_,fVar26);
      fVar26 = floorf(vBounds0.m_data[0] + -0.5);
      fVar27 = floorf(vBounds0.m_data[1] + -0.5);
      local_1b4 = (int)fVar27;
      local_198._0_4_ = floorf(vBounds1.m_data[0] + -0.5);
      pCVar19 = local_200;
      fVar27 = floorf(vBounds1.m_data[1] + -0.5);
      TVar7 = getTextureChannelClass
                        (((ConstPixelBufferAccess *)local_248.m_data)[pCVar19->face].m_format.type);
      if (TVar7 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        local_21c = computeBilinearSearchStepForSnorm(prec);
      }
      else {
        local_21c = 0.0;
        if (TVar7 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_21c = computeBilinearSearchStepForUnorm(prec);
        }
      }
      local_1b8 = 0;
      if ((int)fVar26 <= local_1b4) {
        fVar8 = (float)(int)(float)local_1c0;
        iVar9 = (int)(float)local_1c8;
        uVar10 = (uint)(float)local_1f8;
        local_1a4 = (int)(float)local_1f0;
        iVar11 = (int)(float)local_198._0_4_;
        local_1a8 = (int)fVar27;
        fVar26 = (float)(int)fVar26;
        local_220 = TVar7;
        do {
          local_1b0 = (float)((int)fVar26 + 1);
          fVar27 = fVar8;
          do {
            if (iVar9 < (int)fVar27) {
              iVar14 = 5;
              break;
            }
            quad0.p11.m_data[0] = 0.0;
            quad0.p11.m_data[1] = 0.0;
            quad0.p11.m_data[2] = 0.0;
            quad0.p11.m_data[3] = 0.0;
            quad0.p10.m_data[0] = 0.0;
            quad0.p10.m_data[1] = 0.0;
            quad0.p10.m_data[2] = 0.0;
            quad0.p10.m_data[3] = 0.0;
            quad0.p01.m_data[0] = 0.0;
            quad0.p01.m_data[1] = 0.0;
            quad0.p01.m_data[2] = 0.0;
            quad0.p01.m_data[3] = 0.0;
            quad0.p00.m_data[0] = 0.0;
            quad0.p00.m_data[1] = 0.0;
            quad0.p00.m_data[2] = 0.0;
            quad0.p00.m_data[3] = 0.0;
            quad1.p00.m_data[1] = fVar27;
            quad1.p00.m_data[0] = (float)pCVar19->face;
            quad1.p00.m_data[2] = fVar26;
            CVar33 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
            local_1c0 = CVar33._0_8_;
            local_1c8 = CONCAT44(local_1c8._4_4_,CVar33.t);
            fVar24 = (float)((int)fVar27 + 1);
            quad1.p00.m_data[1] = fVar24;
            quad1.p00.m_data[0] = (float)pCVar19->face;
            quad1.p00.m_data[2] = fVar26;
            CVar33 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
            fVar30 = local_1b0;
            iVar14 = CVar33.t;
            quad1.p00.m_data[1] = fVar27;
            quad1.p00.m_data[0] = (float)pCVar19->face;
            quad1.p00.m_data[2] = local_1b0;
            local_1d0 = (ulong)(uint)fVar27;
            CVar34 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
            uVar12 = CVar34._0_8_;
            local_1f8 = CONCAT44(local_1f8._4_4_,CVar34.t);
            quad1.p00.m_data[1] = fVar24;
            quad1.p00.m_data[0] = (float)pCVar19->face;
            quad1.p00.m_data[2] = fVar30;
            local_1ac = fVar24;
            CVar34 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
            uVar18 = local_1c0 & 0xffffffff;
            uVar20 = uVar12 & 0xffffffff;
            uVar13 = CVar33._0_8_ & 0xffffffff;
            uVar21 = (ulong)CVar34.face;
            local_1f0 = uVar12;
            if ((uVar21 != 6 && uVar13 != 6) && (uVar20 != 6 && uVar18 != 6)) {
              pTVar1 = &((ConstPixelBufferAccess *)local_248.m_data)[uVar18].m_format;
              local_248.m_pitch.m_data[2] = CVar34.t;
              local_1e8 = uVar20;
              local_1e0 = CVar34._0_8_;
              local_1d8 = uVar21;
              if (((((long)local_1c0 < 0) ||
                   (iVar15 = (int)(local_1c0 >> 0x20),
                   ((ConstPixelBufferAccess *)local_248.m_data)[uVar18].m_size.m_data[0] <= iVar15))
                  || ((int)(float)local_1c8 < 0)) ||
                 (((int)pTVar1[1].type <= (int)(float)local_1c8 || ((int)pTVar1[2].order < 1)))) {
                sampleTextureBorder<float>((tcu *)&local_248,pTVar1,local_208);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pTVar1,iVar15,(int)(float)local_1c8
                          );
                bVar6 = isSRGB(*pTVar1);
                if (bVar6) {
                  sRGBToLinear((tcu *)&local_248,&quad1.p00);
                }
                else {
                  local_248.m_format.order = (ChannelOrder)quad1.p00.m_data[0];
                  local_248.m_format.type = (ChannelType)quad1.p00.m_data[1];
                  local_248.m_size.m_data[0] = (int)quad1.p00.m_data[2];
                  local_248.m_size.m_data[1] = (int)quad1.p00.m_data[3];
                }
              }
              quad0.p00.m_data[0] = (float)local_248.m_format.order;
              quad0.p00.m_data[1] = (float)local_248.m_format.type;
              quad0.p00.m_data[2] = (float)local_248.m_size.m_data[0];
              quad0.p00.m_data[3] = (float)local_248.m_size.m_data[1];
              pTVar1 = &((ConstPixelBufferAccess *)local_248.m_data)[uVar13].m_format;
              if ((((long)CVar33._0_8_ < 0) ||
                  (((ConstPixelBufferAccess *)local_248.m_data)[uVar13].m_size.m_data[0] <= CVar33.s
                  )) || ((iVar14 < 0 ||
                         (((int)pTVar1[1].type <= iVar14 || ((int)pTVar1[2].order < 1)))))) {
                sampleTextureBorder<float>((tcu *)&local_248,pTVar1,local_208);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pTVar1,CVar33.s,iVar14);
                bVar6 = isSRGB(*pTVar1);
                if (bVar6) {
                  sRGBToLinear((tcu *)&local_248,&quad1.p00);
                }
                else {
                  local_248.m_format.order = (ChannelOrder)quad1.p00.m_data[0];
                  local_248.m_format.type = (ChannelType)quad1.p00.m_data[1];
                  local_248.m_size.m_data[0] = (int)quad1.p00.m_data[2];
                  local_248.m_size.m_data[1] = (int)quad1.p00.m_data[3];
                }
              }
              pvVar5 = local_248.m_data;
              quad0.p10.m_data[0] = (float)local_248.m_format.order;
              quad0.p10.m_data[1] = (float)local_248.m_format.type;
              quad0.p10.m_data[2] = (float)local_248.m_size.m_data[0];
              quad0.p10.m_data[3] = (float)local_248.m_size.m_data[1];
              pTVar1 = &((ConstPixelBufferAccess *)local_248.m_data)[local_1e8].m_format;
              if (((((long)local_1f0 < 0) ||
                   (iVar14 = (int)(local_1f0 >> 0x20),
                   ((ConstPixelBufferAccess *)local_248.m_data)[local_1e8].m_size.m_data[0] <=
                   iVar14)) || ((int)(float)local_1f8 < 0)) ||
                 (((int)pTVar1[1].type <= (int)(float)local_1f8 || ((int)pTVar1[2].order < 1)))) {
                sampleTextureBorder<float>((tcu *)&local_248,pTVar1,local_208);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pTVar1,iVar14,(int)(float)local_1f8
                          );
                bVar6 = isSRGB(*pTVar1);
                if (bVar6) {
                  sRGBToLinear((tcu *)&local_248,&quad1.p00);
                }
                else {
                  local_248.m_format.order = (ChannelOrder)quad1.p00.m_data[0];
                  local_248.m_format.type = (ChannelType)quad1.p00.m_data[1];
                  local_248.m_size.m_data[0] = (int)quad1.p00.m_data[2];
                  local_248.m_size.m_data[1] = (int)quad1.p00.m_data[3];
                }
              }
              quad0.p01.m_data[0] = (float)local_248.m_format.order;
              quad0.p01.m_data[1] = (float)local_248.m_format.type;
              quad0.p01.m_data[2] = (float)local_248.m_size.m_data[0];
              quad0.p01.m_data[3] = (float)local_248.m_size.m_data[1];
              pTVar1 = &((ConstPixelBufferAccess *)pvVar5)[local_1d8].m_format;
              if (((local_1e0 < 0) ||
                  (iVar14 = (int)((ulong)local_1e0 >> 0x20),
                  ((ConstPixelBufferAccess *)pvVar5)[local_1d8].m_size.m_data[0] <= iVar14)) ||
                 ((local_248.m_pitch.m_data[2] < 0 ||
                  (((int)pTVar1[1].type <= local_248.m_pitch.m_data[2] || ((int)pTVar1[2].order < 1)
                   ))))) {
                sampleTextureBorder<float>((tcu *)&local_248,pTVar1,local_208);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pTVar1,iVar14,
                           local_248.m_pitch.m_data[2]);
                bVar6 = isSRGB(*pTVar1);
                if (bVar6) {
                  sRGBToLinear((tcu *)&local_248,&quad1.p00);
                }
                else {
                  local_248.m_format.order = (ChannelOrder)quad1.p00.m_data[0];
                  local_248.m_format.type = (ChannelType)quad1.p00.m_data[1];
                  local_248.m_size.m_data[0] = (int)quad1.p00.m_data[2];
                  local_248.m_size.m_data[1] = (int)quad1.p00.m_data[3];
                }
              }
              quad0.p11.m_data[0] = (float)local_248.m_format.order;
              quad0.p11.m_data[1] = (float)local_248.m_format.type;
              quad0.p11.m_data[2] = (float)local_248.m_size.m_data[0];
              quad0.p11.m_data[3] = (float)local_248.m_size.m_data[1];
              local_c8 = local_21c;
              if (local_220 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                local_c8 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
              }
            }
            pCVar19 = local_200;
            if ((uVar21 == 6 || uVar13 == 6) || (uVar20 == 6 || uVar18 == 6)) {
              iVar14 = 1;
            }
            else {
              if (iVar11 <= local_1a8) {
                fVar30 = (uBounds0.m_data[0] + -0.5) - (float)(int)local_1d0;
                fVar27 = 1.0;
                if (fVar30 <= 1.0) {
                  fVar27 = fVar30;
                }
                fVar29 = (uBounds0.m_data[1] + -0.5) - (float)(int)local_1d0;
                fVar24 = 1.0;
                if (fVar29 <= 1.0) {
                  fVar24 = fVar29;
                }
                fVar31 = (vBounds0.m_data[0] + -0.5) - (float)(int)fVar26;
                fVar3 = 1.0;
                if (fVar31 <= 1.0) {
                  fVar3 = fVar31;
                }
                fVar32 = (vBounds0.m_data[1] + -0.5) - (float)(int)fVar26;
                fVar4 = 1.0;
                if (fVar32 <= 1.0) {
                  fVar4 = fVar32;
                }
                iVar14 = iVar11;
                do {
                  local_1e8 = CONCAT44(local_1e8._4_4_,iVar14 + 1);
                  uVar12 = (ulong)uVar10;
                  do {
                    CVar25 = (ChannelType)uVar12;
                    if (local_1a4 < (int)CVar25) {
                      iVar14 = 0xb;
                      goto LAB_0091edfb;
                    }
                    quad1.p11.m_data[0] = 0.0;
                    quad1.p11.m_data[1] = 0.0;
                    quad1.p11.m_data[2] = 0.0;
                    quad1.p11.m_data[3] = 0.0;
                    quad1.p10.m_data[0] = 0.0;
                    quad1.p10.m_data[1] = 0.0;
                    quad1.p10.m_data[2] = 0.0;
                    quad1.p10.m_data[3] = 0.0;
                    quad1.p01.m_data[0] = 0.0;
                    quad1.p01.m_data[1] = 0.0;
                    quad1.p01.m_data[2] = 0.0;
                    quad1.p01.m_data[3] = 0.0;
                    quad1.p00.m_data[0] = 0.0;
                    quad1.p00.m_data[1] = 0.0;
                    quad1.p00.m_data[2] = 0.0;
                    quad1.p00.m_data[3] = 0.0;
                    local_248.m_format.type = CVar25;
                    local_248.m_format.order = pCVar19->face;
                    local_248.m_size.m_data[0] = iVar14;
                    CVar33 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_248,dim_00);
                    local_1c0 = CVar33._0_8_;
                    local_1d8 = CONCAT44(local_1d8._4_4_,CVar33.t);
                    fVar17 = (float)(CVar25 + SNORM_INT16);
                    local_248.m_format.type = (ChannelType)fVar17;
                    local_248.m_format.order = pCVar19->face;
                    local_248.m_size.m_data[0] = iVar14;
                    CVar33 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_248,dim_00);
                    local_248.m_pitch.m_data[2] = CVar33.t;
                    local_1c8 = CVar33._0_8_;
                    local_248.m_format.type = CVar25;
                    local_248.m_format.order = pCVar19->face;
                    fVar28 = (float)local_1e8;
                    local_248.m_size.m_data[0] = (int)(float)local_1e8;
                    local_1f8 = uVar12 & 0xffffffff;
                    CVar33 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_248,dim_00);
                    uVar13 = CVar33._0_8_;
                    local_1e0 = CONCAT44(local_1e0._4_4_,CVar33.t);
                    local_248.m_format.type = (ChannelType)fVar17;
                    local_248.m_format.order = pCVar19->face;
                    local_248.m_size.m_data[0] = (int)fVar28;
                    local_1f0 = (ulong)(uint)fVar17;
                    CVar33 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_248,dim_00);
                    uVar12 = local_1c8;
                    iVar15 = CVar33.t;
                    uVar20 = local_1c0 & 0xffffffff;
                    uVar22 = uVar13 & 0xffffffff;
                    uVar18 = local_1c8 & 0xffffffff;
                    uVar21 = (ulong)CVar33.face;
                    local_1d0 = uVar13;
                    if ((uVar21 != 6 && uVar18 != 6) && (uVar22 != 6 && uVar20 != 6)) {
                      local_198._0_8_ = CVar33._0_8_;
                      pTVar1 = &(*local_1a0)[uVar20].m_format;
                      if (((((long)local_1c0 < 0) ||
                           (iVar23 = (int)(local_1c0 >> 0x20),
                           (*local_1a0)[uVar20].m_size.m_data[0] <= iVar23)) || ((int)local_1d8 < 0)
                          ) || (((int)pTVar1[1].type <= (int)local_1d8 || ((int)pTVar1[2].order < 1)
                                ))) {
                        sampleTextureBorder<float>((tcu *)&local_218,pTVar1,local_208);
                      }
                      else {
                        ConstPixelBufferAccess::getPixel
                                  (&local_248,(int)pTVar1,iVar23,(int)local_1d8);
                        bVar6 = isSRGB(*pTVar1);
                        if (bVar6) {
                          sRGBToLinear((tcu *)&local_218,(Vec4 *)&local_248);
                        }
                        else {
                          local_218 = local_248.m_format;
                          aiStack_210[0] = local_248.m_size.m_data[0];
                          aiStack_210[1] = local_248.m_size.m_data[1];
                        }
                      }
                      sampler_00 = local_208;
                      quad1.p00.m_data[0] = (float)local_218.order;
                      quad1.p00.m_data[1] = (float)local_218.type;
                      quad1.p00.m_data[2] = (float)aiStack_210[0];
                      quad1.p00.m_data[3] = (float)aiStack_210[1];
                      pTVar1 = &(*local_1a0)[uVar18].m_format;
                      iVar23 = (int)local_1e0;
                      if ((((long)uVar12 < 0) ||
                          (iVar16 = (int)(uVar12 >> 0x20),
                          (*local_1a0)[uVar18].m_size.m_data[0] <= iVar16)) ||
                         ((local_248.m_pitch.m_data[2] < 0 ||
                          (((int)pTVar1[1].type <= local_248.m_pitch.m_data[2] ||
                           ((int)pTVar1[2].order < 1)))))) {
                        sampleTextureBorder<float>((tcu *)&local_218,pTVar1,local_208);
                      }
                      else {
                        ConstPixelBufferAccess::getPixel
                                  (&local_248,(int)pTVar1,iVar16,local_248.m_pitch.m_data[2]);
                        bVar6 = isSRGB(*pTVar1);
                        if (bVar6) {
                          sRGBToLinear((tcu *)&local_218,(Vec4 *)&local_248);
                          sampler_00 = local_208;
                        }
                        else {
                          local_218 = local_248.m_format;
                          aiStack_210[0] = local_248.m_size.m_data[0];
                          aiStack_210[1] = local_248.m_size.m_data[1];
                          sampler_00 = local_208;
                        }
                      }
                      quad1.p10.m_data[0] = (float)local_218.order;
                      quad1.p10.m_data[1] = (float)local_218.type;
                      quad1.p10.m_data[2] = (float)aiStack_210[0];
                      quad1.p10.m_data[3] = (float)aiStack_210[1];
                      pTVar1 = &(*local_1a0)[uVar22].m_format;
                      if (((((long)local_1d0 < 0) ||
                           (iVar16 = (int)(local_1d0 >> 0x20),
                           (*local_1a0)[uVar22].m_size.m_data[0] <= iVar16)) || (iVar23 < 0)) ||
                         (((int)pTVar1[1].type <= iVar23 || ((int)pTVar1[2].order < 1)))) {
                        sampleTextureBorder<float>((tcu *)&local_218,pTVar1,sampler_00);
                      }
                      else {
                        ConstPixelBufferAccess::getPixel(&local_248,(int)pTVar1,iVar16,iVar23);
                        bVar6 = isSRGB(*pTVar1);
                        if (bVar6) {
                          sRGBToLinear((tcu *)&local_218,(Vec4 *)&local_248);
                        }
                        else {
                          local_218 = local_248.m_format;
                          aiStack_210[0] = local_248.m_size.m_data[0];
                          aiStack_210[1] = local_248.m_size.m_data[1];
                        }
                      }
                      quad1.p01.m_data[0] = (float)local_218.order;
                      quad1.p01.m_data[1] = (float)local_218.type;
                      quad1.p01.m_data[2] = (float)aiStack_210[0];
                      quad1.p01.m_data[3] = (float)aiStack_210[1];
                      pTVar1 = &(*local_1a0)[uVar21].m_format;
                      if ((((long)local_198._0_8_ < 0) ||
                          ((*local_1a0)[uVar21].m_size.m_data[0] <= local_198._4_4_)) ||
                         ((iVar15 < 0 ||
                          (((int)pTVar1[1].type <= iVar15 || ((int)pTVar1[2].order < 1)))))) {
                        sampleTextureBorder<float>((tcu *)&local_218,pTVar1,sampler_00);
                      }
                      else {
                        ConstPixelBufferAccess::getPixel
                                  (&local_248,(int)pTVar1,local_198._4_4_,iVar15);
                        bVar6 = isSRGB(*pTVar1);
                        if (bVar6) {
                          sRGBToLinear((tcu *)&local_218,(Vec4 *)&local_248);
                        }
                        else {
                          local_218 = local_248.m_format;
                          aiStack_210[0] = local_248.m_size.m_data[0];
                          aiStack_210[1] = local_248.m_size.m_data[1];
                        }
                      }
                      quad1.p11.m_data[0] = (float)local_218.order;
                      quad1.p11.m_data[1] = (float)local_218.type;
                      quad1.p11.m_data[2] = (float)aiStack_210[0];
                      quad1.p11.m_data[3] = (float)aiStack_210[1];
                      local_198 = ZEXT416((uint)local_21c);
                      if (local_220 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                        local_198._0_4_ = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
                        local_198._4_4_ = extraout_XMM0_Db;
                        local_198._8_4_ = extraout_XMM0_Dc;
                        local_198._12_4_ = extraout_XMM0_Dd;
                      }
                    }
                    uVar12 = local_1f0;
                    if ((uVar21 == 6 || uVar18 == 6) || (uVar22 == 6 || uVar20 == 6)) {
                      iVar14 = 1;
                      CVar25 = (ChannelType)local_1f8;
                      pCVar19 = local_200;
                      goto LAB_0091edfb;
                    }
                    fVar17 = (float)((int)local_1f0 + -1);
                    fVar28 = (uBounds1.m_data[0] + -0.5) - fVar17;
                    local_f8.m_data[0] = 1.0;
                    if (fVar28 <= 1.0) {
                      local_f8.m_data[0] = fVar28;
                    }
                    local_f8.m_data[0] = (float)(~-(uint)(fVar28 < 0.0) & (uint)local_f8.m_data[0]);
                    fVar17 = (uBounds1.m_data[1] + -0.5) - fVar17;
                    local_f8.m_data[1] = 1.0;
                    if (fVar17 <= 1.0) {
                      local_f8.m_data[1] = fVar17;
                    }
                    local_f8.m_data[1] = (float)(~-(uint)(fVar17 < 0.0) & (uint)local_f8.m_data[1]);
                    fVar28 = (vBounds1.m_data[0] + -0.5) - (float)iVar14;
                    local_100.m_data[0] = 1.0;
                    if (fVar28 <= 1.0) {
                      local_100.m_data[0] = fVar28;
                    }
                    local_100.m_data[0] =
                         (float)(~-(uint)(fVar28 < 0.0) & (uint)local_100.m_data[0]);
                    fVar28 = (vBounds1.m_data[1] + -0.5) - (float)iVar14;
                    local_100.m_data[1] = 1.0;
                    if (fVar28 <= 1.0) {
                      local_100.m_data[1] = fVar28;
                    }
                    local_100.m_data[1] =
                         (float)(~-(uint)(fVar28 < 0.0) & (uint)local_100.m_data[1]);
                    local_248.m_format.type = ~-(uint)(fVar29 < 0.0) & (uint)fVar24;
                    local_248.m_format.order = ~-(uint)(fVar30 < 0.0) & (uint)fVar27;
                    local_218.type = ~-(uint)(fVar32 < 0.0) & (uint)fVar4;
                    local_218.order = ~-(uint)(fVar31 < 0.0) & (uint)fVar3;
                    bVar6 = is2DTrilinearFilterResultValid
                                      (prec,&quad0,&quad1,(Vec2 *)&local_248,(Vec2 *)&local_218,
                                       &local_f8,&local_100,fBounds,
                                       (float)(~-(uint)(local_c8 <= (float)local_198._0_4_) &
                                               local_198._0_4_ |
                                              -(uint)(local_c8 <= (float)local_198._0_4_) &
                                              (uint)local_c8),result);
                    CVar25 = (ChannelType)local_1f8;
                    pCVar19 = local_200;
                  } while (!bVar6);
                  iVar14 = 1;
LAB_0091edfb:
                  if ((int)CVar25 <= local_1a4) goto LAB_0091ee32;
                  iVar14 = (int)(float)local_1e8;
                } while ((int)(float)local_1e8 <= local_1a8);
              }
              iVar14 = 8;
LAB_0091ee32:
              if (iVar14 == 8) {
                iVar14 = 0;
              }
            }
            fVar27 = local_1ac;
          } while (iVar14 == 0);
          if (iVar14 != 5) goto LAB_0091eec5;
          fVar26 = local_1b0;
        } while ((int)local_1b0 <= local_1b4);
        iVar14 = 2;
LAB_0091eec5:
        local_1b8 = (uint)(iVar14 != 2);
      }
      bVar6 = SUB41(local_1b8,0);
    }
    else {
      quad0.p00.m_data[0] = coords->s;
      quad0.p00.m_data[1] = coords->t;
      bVar6 = isLinearMipmapLinearSampleResultValid
                        (*faces0 + CVar2,*faces1 + CVar2,sampler,prec,(Vec2 *)&quad0,0,fBounds,
                         result);
    }
  }
  else {
    quad0.p00.m_data[0] = coords->s;
    quad0.p00.m_data[1] = coords->t;
    bVar6 = isNearestMipmapLinearSampleResultValid
                      (*faces0 + coords->face,*faces1 + coords->face,sampler,prec,(Vec2 *)&quad0,0,
                       fBounds,result);
  }
  return bVar6;
}

Assistant:

static bool isCubeMipmapLinearSampleResultValid (const ConstPixelBufferAccess	(&faces0)[CUBEFACE_LAST],
												 const ConstPixelBufferAccess	(&faces1)[CUBEFACE_LAST],
												 const Sampler&					sampler,
												 const Sampler::FilterMode		levelFilter,
												 const LookupPrecision&			prec,
												 const CubeFaceFloatCoords&		coords,
												 const Vec2&					fBounds,
												 const Vec4&					result)
{
	if (levelFilter == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamplessLinearMipmapLinearSampleResultValid(faces0, faces1, sampler, prec, coords, fBounds, result);
		else
			return isLinearMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
	}
	else
		return isNearestMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
}